

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O1

void __thiscall Assimp::JSONWriter::~JSONWriter(JSONWriter *this)

{
  pointer pcVar1;
  
  Flush(this);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->buff);
  std::ios_base::~ios_base((ios_base *)&this->field_0xc8);
  pcVar1 = (this->newline)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->newline).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->indent)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->indent).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~JSONWriter() {
        Flush();
    }